

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O1

exr_result_t
exr_attr_chlist_add_with_length
          (exr_context_t ctxt,exr_attr_chlist_t *clist,char *name,int32_t namelen,
          exr_pixel_type_t ptype,exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  exr_attr_chlist_entry_t *peVar5;
  exr_result_t eVar6;
  int iVar7;
  exr_attr_chlist_entry_t *peVar8;
  long lVar9;
  ulong uVar10;
  char **ppcVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  long lVar15;
  bool bVar16;
  exr_attr_chlist_entry_t nent;
  uint local_7c;
  exr_result_t local_78;
  exr_attr_string_t local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  exr_attr_chlist_entry_t *local_40;
  char **local_38;
  
  local_58 = 0;
  uStack_50 = 0;
  local_68.length = 0;
  local_68.alloc_size = 0;
  local_68.str = (char *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (clist == (exr_attr_chlist_t *)0x0) {
    eVar6 = (*ctxt->report_error)(ctxt,3,"Invalid channel list pointer to chlist_add_with_length");
    return eVar6;
  }
  if (name == (char *)0x0) {
    name = "<NULL>";
  }
  else if ((namelen != 0) && (*name != '\0')) {
    if ((int)(uint)ctxt->max_name_length < namelen) {
      eVar6 = (*ctxt->print_error)
                        (ctxt,0xc,
                         "Channel name must shorter than length allowed by file (%d), received \'%s\' (%d)"
                         ,(ulong)ctxt->max_name_length,name,(ulong)(uint)namelen);
      return eVar6;
    }
    if (ptype < EXR_PIXEL_LAST_TYPE) {
      if (islinear < 2) {
        if (xsamp < 1 || ysamp < 1) {
          eVar6 = (*ctxt->print_error)
                            (ctxt,3,
                             "Invalid pixel sampling (x %d y %d) adding channel \'%s\' to list",
                             (ulong)(uint)xsamp,(ulong)(uint)ysamp,name);
          return eVar6;
        }
        local_40 = clist->entries;
        if (clist->num_channels < 1) {
          bVar16 = true;
          local_7c = 0;
        }
        else {
          ppcVar11 = &(local_40->name).str;
          lVar15 = 0;
          local_7c = 0;
          do {
            local_38 = ppcVar11;
            iVar7 = strcmp(name,*ppcVar11);
            if (iVar7 < 0) {
              bVar16 = false;
              iVar7 = 2;
              local_7c = (uint)lVar15;
            }
            else if (iVar7 == 0) {
              local_78 = (*ctxt->print_error)
                                   (ctxt,3,"Attempt to add duplicate channel \'%s\' to channel list"
                                    ,name);
              bVar16 = false;
              iVar7 = 1;
            }
            else {
              local_7c = (uint)lVar15 + 1;
              iVar7 = 0;
              bVar16 = true;
            }
            if (!bVar16) goto LAB_0012065a;
            lVar15 = lVar15 + 1;
            ppcVar11 = local_38 + 4;
          } while (lVar15 < clist->num_channels);
          iVar7 = 2;
LAB_0012065a:
          bVar16 = iVar7 == 2;
        }
        eVar6 = local_78;
        if ((bVar16) &&
           (eVar6 = exr_attr_string_create_with_length(ctxt,&local_68,name,namelen), eVar6 == 0)) {
          iVar7 = clist->num_channels;
          lVar15 = (long)iVar7;
          local_58._0_5_ = CONCAT14((char)islinear,ptype);
          uStack_50 = CONCAT44(ysamp,xsamp);
          if (iVar7 < clist->num_alloced) {
            peVar8 = clist->entries;
          }
          else {
            iVar1 = clist->num_alloced * 2;
            iVar14 = iVar7 + 2;
            if (iVar7 < iVar1) {
              iVar14 = iVar1;
            }
            peVar8 = (exr_attr_chlist_entry_t *)(*ctxt->alloc_fn)((long)iVar14 << 5);
            if (peVar8 == (exr_attr_chlist_entry_t *)0x0) {
              if ((local_68.str != (char *)0x0) && (0 < local_68.alloc_size)) {
                (*ctxt->free_fn)(local_68.str);
              }
              local_68.length = 0;
              local_68.alloc_size = 0;
              local_68.str = (char *)0x0;
              local_78 = (*ctxt->standard_error)(ctxt,1);
            }
            else {
              clist->num_alloced = iVar14;
            }
            if (peVar8 == (exr_attr_chlist_entry_t *)0x0) {
              return local_78;
            }
          }
          lVar9 = (long)(int)local_7c;
          if ((int)local_7c < iVar7) {
            lVar13 = lVar15 << 5;
            do {
              uVar2 = *(undefined8 *)(local_40[-1].reserved + lVar13 + -0x15);
              uVar3 = *(undefined8 *)(local_40[-1].reserved + lVar13 + -0x15 + 8);
              uVar4 = *(undefined8 *)(local_40->reserved + lVar13 + -0x25 + 8);
              *(undefined8 *)(peVar8->reserved + lVar13 + -5) =
                   *(undefined8 *)(local_40->reserved + lVar13 + -0x25);
              *(undefined8 *)(peVar8->reserved + lVar13 + -5 + 8) = uVar4;
              *(undefined8 *)(peVar8->reserved + lVar13 + -0x15) = uVar2;
              *(undefined8 *)(peVar8->reserved + lVar13 + -0x15 + 8) = uVar3;
              lVar15 = lVar15 + -1;
              lVar13 = lVar13 + -0x20;
            } while (lVar9 < lVar15);
          }
          peVar5 = peVar8 + lVar9;
          peVar5->pixel_type = (undefined4)local_58;
          peVar5->p_linear = local_58._4_1_;
          peVar5->reserved[0] = local_58._5_1_;
          peVar5->reserved[1] = local_58._6_1_;
          peVar5->reserved[2] = local_58._7_1_;
          *(undefined8 *)(&peVar5->pixel_type + 2) = uStack_50;
          peVar5 = peVar8 + lVar9;
          (peVar5->name).length = local_68.length;
          (peVar5->name).alloc_size = local_68.alloc_size;
          (peVar5->name).str = local_68.str;
          if ((local_40 != (exr_attr_chlist_entry_t *)0x0) && (peVar8 != local_40)) {
            if (0 < (int)local_7c) {
              lVar15 = 0;
              do {
                uVar2 = *(undefined8 *)(local_40->reserved + lVar15 + -0x15);
                uVar3 = *(undefined8 *)(local_40->reserved + lVar15 + -0x15 + 8);
                uVar4 = *(undefined8 *)(local_40->reserved + lVar15 + -5 + 8);
                *(undefined8 *)(peVar8->reserved + lVar15 + -5) =
                     *(undefined8 *)(local_40->reserved + lVar15 + -5);
                *(undefined8 *)(peVar8->reserved + lVar15 + -5 + 8) = uVar4;
                *(undefined8 *)(peVar8->reserved + lVar15 + -0x15) = uVar2;
                *(undefined8 *)(peVar8->reserved + lVar15 + -0x15 + 8) = uVar3;
                lVar15 = lVar15 + 0x20;
              } while ((ulong)local_7c << 5 != lVar15);
            }
            (*ctxt->free_fn)(local_40);
          }
          clist->num_channels = iVar7 + 1;
          clist->entries = peVar8;
          eVar6 = 0;
        }
        return eVar6;
      }
      UNRECOVERED_JUMPTABLE = ctxt->print_error;
      pcVar12 = "Invalid perceptual linear flag value (%d) adding channel \'%s\' to list";
      uVar10 = (ulong)islinear;
    }
    else {
      UNRECOVERED_JUMPTABLE = ctxt->print_error;
      pcVar12 = "Invalid pixel type specified (%d) adding channel \'%s\' to list";
      uVar10 = (ulong)ptype;
    }
    eVar6 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar12,uVar10,name,UNRECOVERED_JUMPTABLE);
    return eVar6;
  }
  eVar6 = (*ctxt->print_error)
                    (ctxt,3,"Channel name must not be empty, received \'%s\'",name,ctxt->print_error
                    );
  return eVar6;
}

Assistant:

exr_result_t
exr_attr_chlist_add_with_length (
    exr_context_t              ctxt,
    exr_attr_chlist_t*         clist,
    const char*                name,
    int32_t                    namelen,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    exr_attr_chlist_entry_t  nent = {{0}};
    exr_attr_chlist_entry_t *nlist, *olist;
    int                      newcount, insertpos;
    int32_t                  maxlen;
    exr_result_t             rv;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    maxlen = ctxt->max_name_length;

    if (!clist)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid channel list pointer to chlist_add_with_length");

    if (!name || name[0] == '\0' || namelen == 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Channel name must not be empty, received '%s'",
            (name ? name : "<NULL>"));

    if (namelen > maxlen)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Channel name must shorter than length allowed by file (%d), received '%s' (%d)",
            maxlen,
            name,
            namelen);

    if (ptype != EXR_PIXEL_UINT && ptype != EXR_PIXEL_HALF &&
        ptype != EXR_PIXEL_FLOAT)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel type specified (%d) adding channel '%s' to list",
            (int) ptype,
            name);

    if (islinear != EXR_PERCEPTUALLY_LOGARITHMIC &&
        islinear != EXR_PERCEPTUALLY_LINEAR)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid perceptual linear flag value (%d) adding channel '%s' to list",
            (int) islinear,
            name);

    if (xsamp <= 0 || ysamp <= 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel sampling (x %d y %d) adding channel '%s' to list",
            xsamp,
            ysamp,
            name);

    insertpos = 0;
    olist     = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);
    for (int32_t c = 0; c < clist->num_channels; ++c)
    {
        int ord = strcmp (name, olist[c].name.str);
        if (ord < 0)
        {
            insertpos = c;
            break;
        }
        else if (ord == 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Attempt to add duplicate channel '%s' to channel list",
                name);
        }
        else
            insertpos = c + 1;
    }

    /* temporarily use newcount as a return value check */
    rv = exr_attr_string_create_with_length (ctxt, &(nent.name), name, namelen);
    if (rv != EXR_ERR_SUCCESS) return rv;

    newcount        = clist->num_channels + 1;
    nent.pixel_type = ptype;
    nent.p_linear   = (uint8_t) islinear;
    nent.x_sampling = xsamp;
    nent.y_sampling = ysamp;

    if (newcount > clist->num_alloced)
    {
        int nsz = clist->num_alloced * 2;
        if (newcount > nsz) nsz = newcount + 1;
        nlist = (exr_attr_chlist_entry_t*) ctxt->alloc_fn (
            sizeof (*nlist) * (size_t) nsz);
        if (nlist == NULL)
        {
            exr_attr_string_destroy (ctxt, &(nent.name));
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
        clist->num_alloced = nsz;
    }
    else
        nlist = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

    /* since we can re-use same memory, have to have slightly more
     * complex logic to avoid overwrites, find where we will insert
     * and copy entries after that first */

    /* shift old entries further first */
    for (int i = newcount - 1; i > insertpos; --i)
        nlist[i] = olist[i - 1];
    nlist[insertpos] = nent;
    if (olist && nlist != olist)
    {
        for (int i = 0; i < insertpos; ++i)
            nlist[i] = olist[i];

        ctxt->free_fn (olist);
    }

    clist->num_channels = newcount;
    clist->entries      = nlist;

    return EXR_ERR_SUCCESS;
}